

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O0

bool spirv_cross::is_valid_identifier(string *name)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  char *pcVar5;
  reference pcVar6;
  bool is_underscore;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_50;
  char c_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  string *__range1_1;
  bool saw_underscore;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_30;
  char c;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  string *name_local;
  
  uVar4 = ::std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    pcVar5 = (char *)::std::__cxx11::string::operator[]((ulong)name);
    bVar2 = is_numeric(*pcVar5);
    if (bVar2) {
      name_local._7_1_ = false;
    }
    else {
      __end1._M_current = (char *)::std::__cxx11::string::begin();
      _Stack_30._M_current = (char *)::std::__cxx11::string::end();
      while (bVar2 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffd0), bVar2) {
        pcVar6 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&__end1);
        cVar1 = *pcVar6;
        bVar2 = is_alphanumeric(cVar1);
        if ((!bVar2) && (cVar1 != '_')) {
          return false;
        }
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&__end1);
      }
      __end1_1._M_current = (char *)::std::__cxx11::string::begin();
      _Stack_50._M_current = (char *)::std::__cxx11::string::end();
      bVar2 = false;
      while (bVar3 = __gnu_cxx::operator!=(&__end1_1,&stack0xffffffffffffffb0), bVar3) {
        pcVar6 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&__end1_1);
        cVar1 = *pcVar6;
        if ((cVar1 == '_') && (bVar2)) {
          return false;
        }
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&__end1_1);
        bVar2 = cVar1 == '_';
      }
      name_local._7_1_ = true;
    }
  }
  else {
    name_local._7_1_ = true;
  }
  return name_local._7_1_;
}

Assistant:

static bool is_valid_identifier(const string &name)
{
	if (name.empty())
		return true;

	if (is_numeric(name[0]))
		return false;

	for (auto c : name)
		if (!is_alphanumeric(c) && c != '_')
			return false;

	bool saw_underscore = false;
	// Two underscores in a row is not a valid identifier either.
	// Technically reserved, but it's easier to treat it as invalid.
	for (auto c : name)
	{
		bool is_underscore = c == '_';
		if (is_underscore && saw_underscore)
			return false;
		saw_underscore = is_underscore;
	}

	return true;
}